

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint myid;
  uint uVar3;
  uint onoff;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  SUNLinearSolver S;
  N_Vector v_vec;
  N_Vector x_00;
  SUNMatrix A;
  N_Vector s2;
  undefined8 uVar15;
  void *pvVar16;
  long in_RSI;
  int in_EDI;
  char *funcname;
  sunrealtype sVar17;
  SUNContext sunctx;
  double tol;
  sunrealtype *vecdata;
  sunindextype i;
  int print_timing;
  int maxl;
  int pretype;
  int gstype;
  UserData ProbData;
  N_Vector b;
  N_Vector x;
  N_Vector xhat;
  SUNLinearSolver LS;
  int passfail;
  int fails;
  undefined4 local_88;
  int in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff88;
  N_Vector s1;
  SUNLinearSolver p_Var18;
  N_Vector z_vec;
  uint local_18;
  uint local_4;
  
  iVar1 = SUNContext_Create(0,&local_88);
  if (iVar1 == 0) {
    if (in_EDI < 7) {
      printf("ERROR: SIX (6) Inputs required:\n");
      printf("  Problem size should be >0\n");
      printf("  Gram-Schmidt orthogonalization type should be 1 or 2\n");
      printf("  Preconditioning type should be 1 or 2\n");
      printf("  Maximum Krylov subspace dimension should be >0\n");
      printf("  Solver tolerance should be >0\n");
      printf("  timing output flag should be 0 or 1 \n");
      local_4 = 1;
    }
    else {
      problem_size = atol(*(char **)(in_RSI + 8));
      if (problem_size < 1) {
        printf("ERROR: Problem size must be a positive integer\n");
        local_4 = 1;
      }
      else {
        z_vec = (N_Vector)problem_size;
        uVar2 = atoi(*(char **)(in_RSI + 0x10));
        if (((int)uVar2 < 1) || (2 < (int)uVar2)) {
          printf("ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2\n");
          local_4 = 1;
        }
        else {
          myid = atoi(*(char **)(in_RSI + 0x18));
          if (((int)myid < 1) || (2 < (int)myid)) {
            printf("ERROR: Preconditioning type must be either 1 or 2\n");
            local_4 = 1;
          }
          else {
            uVar3 = atoi(*(char **)(in_RSI + 0x20));
            if ((int)uVar3 < 1) {
              printf("ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
              local_4 = 1;
            }
            else {
              funcname = (char *)atof(*(char **)(in_RSI + 0x28));
              if (0.0 < (double)funcname) {
                onoff = atoi(*(char **)(in_RSI + 0x30));
                SetTiming(onoff);
                printf("\nSPGMR linear solver test:\n");
                printf("  Problem size = %ld\n",z_vec);
                printf("  Gram-Schmidt orthogonalization type = %i\n",(ulong)uVar2);
                printf("  Preconditioning type = %i\n",(ulong)myid);
                printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar3);
                printf("  Solver Tolerance = %g\n",funcname);
                printf("  timing output flag = %i\n\n",(ulong)onoff);
                uVar13 = N_VNew_Serial(z_vec,CONCAT44(in_stack_ffffffffffffff7c,local_88));
                iVar1 = check_flag(in_stack_ffffffffffffff88,funcname,in_stack_ffffffffffffff7c);
                if (iVar1 == 0) {
                  uVar14 = N_VNew_Serial(z_vec,CONCAT44(in_stack_ffffffffffffff7c,local_88));
                  iVar1 = check_flag(in_stack_ffffffffffffff88,funcname,in_stack_ffffffffffffff7c);
                  if (iVar1 == 0) {
                    S = (SUNLinearSolver)
                        N_VNew_Serial(z_vec,CONCAT44(in_stack_ffffffffffffff7c,local_88));
                    iVar1 = check_flag(in_stack_ffffffffffffff88,funcname,in_stack_ffffffffffffff7c)
                    ;
                    if (iVar1 == 0) {
                      v_vec = (N_Vector)
                              N_VNew_Serial(z_vec,CONCAT44(in_stack_ffffffffffffff7c,local_88));
                      iVar1 = check_flag(in_stack_ffffffffffffff88,funcname,
                                         in_stack_ffffffffffffff7c);
                      if (iVar1 == 0) {
                        x_00 = (N_Vector)
                               N_VNew_Serial(z_vec,CONCAT44(in_stack_ffffffffffffff7c,local_88));
                        iVar1 = check_flag(in_stack_ffffffffffffff88,funcname,
                                           in_stack_ffffffffffffff7c);
                        if (iVar1 == 0) {
                          A = (SUNMatrix)
                              N_VNew_Serial(z_vec,CONCAT44(in_stack_ffffffffffffff7c,local_88));
                          iVar1 = check_flag(in_stack_ffffffffffffff88,funcname,
                                             in_stack_ffffffffffffff7c);
                          if (iVar1 == 0) {
                            s2 = (N_Vector)N_VGetArrayPointer(uVar14);
                            for (s1 = (N_Vector)0x0; (long)s1 < (long)z_vec;
                                s1 = (N_Vector)((long)&s1->content + 1)) {
                              sVar17 = urand();
                              (&s2->content)[(long)s1] = (void *)(sVar17 + 1.0);
                            }
                            N_VConst(0x4014000000000000,v_vec);
                            uVar15 = SUNLinSol_SPGMR(uVar13,myid,uVar3,
                                                     CONCAT44(in_stack_ffffffffffffff7c,local_88));
                            iVar1 = Test_SUNLinSolGetType
                                              ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                               (SUNLinearSolver_Type)((ulong)s1 >> 0x20),(int)s1);
                            iVar4 = Test_SUNLinSolGetID((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                        (SUNLinearSolver_ID)((ulong)s1 >> 0x20),
                                                        (int)s1);
                            iVar5 = Test_SUNLinSolSetATimes
                                              ((SUNLinearSolver)CONCAT44(uVar3,onoff),s1,
                                               (SUNATimesFn)s2,(int)((ulong)funcname >> 0x20));
                            iVar6 = Test_SUNLinSolSetPreconditioner
                                              ((SUNLinearSolver)z_vec,(void *)CONCAT44(uVar2,myid),
                                               (SUNPSetupFn)CONCAT44(uVar3,onoff),(SUNPSolveFn)s1,
                                               (int)((ulong)s2 >> 0x20));
                            iVar7 = Test_SUNLinSolSetScalingVectors
                                              ((SUNLinearSolver)CONCAT44(uVar3,onoff),s1,s2,
                                               (int)((ulong)funcname >> 0x20));
                            iVar8 = Test_SUNLinSolSetZeroGuess
                                              ((SUNLinearSolver)s2,(int)((ulong)funcname >> 0x20));
                            iVar9 = Test_SUNLinSolInitialize
                                              ((SUNLinearSolver)s2,(int)((ulong)funcname >> 0x20));
                            iVar10 = Test_SUNLinSolSpace((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                         (int)((ulong)s1 >> 0x20));
                            iVar11 = SUNLinSol_SPGMRSetGSType(uVar15,uVar2);
                            uVar12 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4
                                                                                               + 
                                                  iVar1;
                            if (uVar12 == 0) {
                              printf(
                                    "SUCCESS: SUNLinSol_SPGMR module passed all initialization tests\n\n"
                                    );
                              N_VConst(0x3ff0000000000000,x_00);
                              N_VConst(0x3ff0000000000000,A);
                              N_VDiv(uVar14,A,uVar13);
                              iVar1 = ATimes(x_00,v_vec,z_vec);
                              iVar4 = check_flag(s2,funcname,in_stack_ffffffffffffff7c);
                              if (iVar4 == 0) {
                                iVar4 = SUNLinSol_SPGMRSetPrecType(uVar15,0);
                                iVar5 = Test_SUNLinSolSetup((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                            (SUNMatrix)s1,(int)((ulong)s2 >> 0x20));
                                iVar6 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,uVar2,
                                                            myid);
                                iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,uVar2,
                                                            myid);
                                iVar8 = Test_SUNLinSolLastFlag
                                                  ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                   (int)((ulong)s1 >> 0x20));
                                iVar9 = Test_SUNLinSolNumIters
                                                  ((SUNLinearSolver)s1,(int)((ulong)s2 >> 0x20));
                                iVar10 = Test_SUNLinSolResNorm
                                                   ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                    (int)((ulong)s1 >> 0x20));
                                iVar11 = Test_SUNLinSolResid((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                             (int)((ulong)s1 >> 0x20));
                                uVar12 = iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + 
                                                  iVar4 + iVar1;
                                if (uVar12 == 0) {
                                  printf(
                                        "SUCCESS: SUNLinSol_SPGMR module, problem 1, passed all tests\n\n"
                                        );
                                }
                                else {
                                  printf("FAIL: SUNLinSol_SPGMR module, problem 1, failed %i tests\n\n"
                                         ,(ulong)uVar12);
                                }
                                local_18 = (uint)(uVar12 != 0);
                                N_VConst(0x3ff0000000000000,x_00);
                                N_VConst(0x3ff0000000000000,A);
                                N_VDiv(uVar14,A,uVar13);
                                iVar1 = ATimes(x_00,v_vec,z_vec);
                                iVar4 = check_flag(s2,funcname,in_stack_ffffffffffffff7c);
                                iVar5 = (int)((ulong)s2 >> 0x20);
                                if (iVar4 == 0) {
                                  iVar4 = SUNLinSol_SPGMRSetPrecType(uVar15,myid);
                                  iVar6 = Test_SUNLinSolSetup((SUNLinearSolver)CONCAT44(uVar3,onoff)
                                                              ,(SUNMatrix)s1,iVar5);
                                  iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                              uVar2,myid);
                                  iVar8 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                              uVar2,myid);
                                  iVar9 = Test_SUNLinSolLastFlag
                                                    ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                     (int)((ulong)s1 >> 0x20));
                                  iVar5 = Test_SUNLinSolNumIters((SUNLinearSolver)s1,iVar5);
                                  iVar11 = (int)((ulong)s1 >> 0x20);
                                  iVar10 = Test_SUNLinSolResNorm
                                                     ((SUNLinearSolver)CONCAT44(uVar3,onoff),iVar11)
                                  ;
                                  iVar11 = Test_SUNLinSolResid((SUNLinearSolver)
                                                               CONCAT44(uVar3,onoff),iVar11);
                                  uVar12 = iVar11 + iVar10 + iVar5 + iVar9 + iVar8 + iVar7 + iVar6 +
                                                                                             iVar4 +
                                                                                             iVar1;
                                  if (uVar12 == 0) {
                                    printf(
                                          "SUCCESS: SUNLinSol_SPGMR module, problem 2, passed all tests\n\n"
                                          );
                                  }
                                  else {
                                    printf("FAIL: SUNLinSol_SPGMR module, problem 2, failed %i tests\n\n"
                                           ,(ulong)uVar12);
                                    local_18 = local_18 + 1;
                                  }
                                  pvVar16 = (void *)N_VGetArrayPointer(x_00);
                                  for (p_Var18 = (SUNLinearSolver)0x0; (long)p_Var18 < (long)z_vec;
                                      p_Var18 = (SUNLinearSolver)((long)&p_Var18->content + 1)) {
                                    sVar17 = urand();
                                    *(double *)((long)pvVar16 + (long)p_Var18 * 8) =
                                         sVar17 * 1000.0 + 1.0;
                                  }
                                  N_VConst(0x3ff0000000000000,A);
                                  N_VDiv(uVar14,A,uVar13);
                                  iVar1 = ATimes(x_00,v_vec,z_vec);
                                  iVar4 = check_flag(pvVar16,funcname,in_stack_ffffffffffffff7c);
                                  iVar5 = (int)((ulong)pvVar16 >> 0x20);
                                  if (iVar4 == 0) {
                                    iVar4 = SUNLinSol_SPGMRSetPrecType(uVar15,0);
                                    iVar6 = Test_SUNLinSolSetup((SUNLinearSolver)
                                                                CONCAT44(uVar3,onoff),
                                                                (SUNMatrix)p_Var18,iVar5);
                                    iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                                uVar2,myid);
                                    iVar8 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                                uVar2,myid);
                                    iVar9 = Test_SUNLinSolLastFlag
                                                      ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                       (int)((ulong)p_Var18 >> 0x20));
                                    iVar5 = Test_SUNLinSolNumIters(p_Var18,iVar5);
                                    iVar11 = (int)((ulong)p_Var18 >> 0x20);
                                    iVar10 = Test_SUNLinSolResNorm
                                                       ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                        iVar11);
                                    iVar11 = Test_SUNLinSolResid((SUNLinearSolver)
                                                                 CONCAT44(uVar3,onoff),iVar11);
                                    uVar12 = iVar11 + iVar10 + iVar5 + iVar9 + iVar8 + iVar7 + iVar6
                                                                                               + 
                                                  iVar4 + iVar1;
                                    if (uVar12 == 0) {
                                      printf(
                                            "SUCCESS: SUNLinSol_SPGMR module, problem 3, passed all tests\n\n"
                                            );
                                    }
                                    else {
                                      printf("FAIL: SUNLinSol_SPGMR module, problem 3, failed %i tests\n\n"
                                             ,(ulong)uVar12);
                                      local_18 = local_18 + 1;
                                    }
                                    pvVar16 = (void *)N_VGetArrayPointer(x_00);
                                    for (p_Var18 = (SUNLinearSolver)0x0; (long)p_Var18 < (long)z_vec
                                        ; p_Var18 = (SUNLinearSolver)((long)&p_Var18->content + 1))
                                    {
                                      sVar17 = urand();
                                      *(double *)((long)pvVar16 + (long)p_Var18 * 8) =
                                           sVar17 * 1000.0 + 1.0;
                                    }
                                    N_VConst(0x3ff0000000000000,A);
                                    N_VDiv(uVar14,A,uVar13);
                                    iVar1 = ATimes(x_00,v_vec,z_vec);
                                    iVar4 = check_flag(pvVar16,funcname,in_stack_ffffffffffffff7c);
                                    iVar5 = (int)((ulong)pvVar16 >> 0x20);
                                    if (iVar4 == 0) {
                                      iVar4 = SUNLinSol_SPGMRSetPrecType(uVar15,myid);
                                      iVar6 = Test_SUNLinSolSetup((SUNLinearSolver)
                                                                  CONCAT44(uVar3,onoff),
                                                                  (SUNMatrix)p_Var18,iVar5);
                                      iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                                  uVar2,myid);
                                      iVar8 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                                  uVar2,myid);
                                      iVar9 = Test_SUNLinSolLastFlag
                                                        ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                         (int)((ulong)p_Var18 >> 0x20));
                                      iVar5 = Test_SUNLinSolNumIters(p_Var18,iVar5);
                                      iVar11 = (int)((ulong)p_Var18 >> 0x20);
                                      iVar10 = Test_SUNLinSolResNorm
                                                         ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                          iVar11);
                                      iVar11 = Test_SUNLinSolResid((SUNLinearSolver)
                                                                   CONCAT44(uVar3,onoff),iVar11);
                                      uVar12 = iVar11 + iVar10 + iVar5 + iVar9 + iVar8 + iVar7 + 
                                                  iVar6 + iVar4 + iVar1;
                                      if (uVar12 == 0) {
                                        printf(
                                              "SUCCESS: SUNLinSol_SPGMR module, problem 4, passed all tests\n\n"
                                              );
                                      }
                                      else {
                                        printf("FAIL: SUNLinSol_SPGMR module, problem 4, failed %i tests\n\n"
                                               ,(ulong)uVar12);
                                        local_18 = local_18 + 1;
                                      }
                                      N_VConst(0x3ff0000000000000,x_00);
                                      pvVar16 = (void *)N_VGetArrayPointer(A);
                                      for (p_Var18 = (SUNLinearSolver)0x0;
                                          (long)p_Var18 < (long)z_vec;
                                          p_Var18 = (SUNLinearSolver)((long)&p_Var18->content + 1))
                                      {
                                        sVar17 = urand();
                                        *(double *)((long)pvVar16 + (long)p_Var18 * 8) =
                                             sVar17 * 1000.0 + 1.0;
                                      }
                                      N_VDiv(uVar14,A,uVar13);
                                      iVar1 = ATimes(x_00,v_vec,z_vec);
                                      iVar4 = check_flag(pvVar16,funcname,in_stack_ffffffffffffff7c)
                                      ;
                                      iVar5 = (int)((ulong)pvVar16 >> 0x20);
                                      if (iVar4 == 0) {
                                        iVar4 = SUNLinSol_SPGMRSetPrecType(uVar15,0);
                                        iVar6 = Test_SUNLinSolSetup((SUNLinearSolver)
                                                                    CONCAT44(uVar3,onoff),
                                                                    (SUNMatrix)p_Var18,iVar5);
                                        iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,
                                                                    (sunrealtype)z_vec,uVar2,myid);
                                        iVar8 = Test_SUNLinSolSolve(S,A,x_00,v_vec,
                                                                    (sunrealtype)z_vec,uVar2,myid);
                                        iVar9 = Test_SUNLinSolLastFlag
                                                          ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                           (int)((ulong)p_Var18 >> 0x20));
                                        iVar5 = Test_SUNLinSolNumIters(p_Var18,iVar5);
                                        iVar11 = (int)((ulong)p_Var18 >> 0x20);
                                        iVar10 = Test_SUNLinSolResNorm
                                                           ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                            iVar11);
                                        iVar11 = Test_SUNLinSolResid((SUNLinearSolver)
                                                                     CONCAT44(uVar3,onoff),iVar11);
                                        uVar12 = iVar11 + iVar10 + iVar5 + iVar9 + iVar8 + iVar7 + 
                                                  iVar6 + iVar4 + iVar1;
                                        if (uVar12 == 0) {
                                          printf(
                                                "SUCCESS: SUNLinSol_SPGMR module, problem 5, passed all tests\n\n"
                                                );
                                        }
                                        else {
                                          printf("FAIL: SUNLinSol_SPGMR module, problem 5, failed %i tests\n\n"
                                                 ,(ulong)uVar12);
                                          local_18 = local_18 + 1;
                                        }
                                        N_VConst(0x3ff0000000000000,x_00);
                                        pvVar16 = (void *)N_VGetArrayPointer(A);
                                        for (p_Var18 = (SUNLinearSolver)0x0;
                                            (long)p_Var18 < (long)z_vec;
                                            p_Var18 = (SUNLinearSolver)((long)&p_Var18->content + 1)
                                            ) {
                                          sVar17 = urand();
                                          *(double *)((long)pvVar16 + (long)p_Var18 * 8) =
                                               sVar17 * 1000.0 + 1.0;
                                        }
                                        N_VDiv(uVar14,A,uVar13);
                                        iVar1 = ATimes(x_00,v_vec,z_vec);
                                        iVar4 = check_flag(pvVar16,funcname,
                                                           in_stack_ffffffffffffff7c);
                                        iVar5 = (int)((ulong)pvVar16 >> 0x20);
                                        if (iVar4 == 0) {
                                          iVar4 = SUNLinSol_SPGMRSetPrecType(uVar15,myid);
                                          iVar6 = Test_SUNLinSolSetup((SUNLinearSolver)
                                                                      CONCAT44(uVar3,onoff),
                                                                      (SUNMatrix)p_Var18,iVar5);
                                          iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,
                                                                      (sunrealtype)z_vec,uVar2,myid)
                                          ;
                                          iVar8 = Test_SUNLinSolSolve(S,A,x_00,v_vec,
                                                                      (sunrealtype)z_vec,uVar2,myid)
                                          ;
                                          iVar9 = Test_SUNLinSolLastFlag
                                                            ((SUNLinearSolver)CONCAT44(uVar3,onoff),
                                                             (int)((ulong)p_Var18 >> 0x20));
                                          iVar5 = Test_SUNLinSolNumIters(p_Var18,iVar5);
                                          iVar11 = (int)((ulong)p_Var18 >> 0x20);
                                          iVar10 = Test_SUNLinSolResNorm
                                                             ((SUNLinearSolver)CONCAT44(uVar3,onoff)
                                                              ,iVar11);
                                          iVar11 = Test_SUNLinSolResid((SUNLinearSolver)
                                                                       CONCAT44(uVar3,onoff),iVar11)
                                          ;
                                          uVar2 = iVar11 + iVar10 + iVar5 + iVar9 + iVar8 + iVar7 + 
                                                  iVar6 + iVar4 + iVar1;
                                          if (uVar2 == 0) {
                                            printf(
                                                  "SUCCESS: SUNLinSol_SPGMR module, problem 6, passed all tests\n\n"
                                                  );
                                          }
                                          else {
                                            printf(
                                                  "FAIL: SUNLinSol_SPGMR module, problem 6, failed %i tests\n\n"
                                                  ,(ulong)uVar2);
                                            local_18 = local_18 + 1;
                                          }
                                          SUNLinSolFree(uVar15);
                                          N_VDestroy(uVar13);
                                          N_VDestroy(uVar14);
                                          N_VDestroy(S);
                                          N_VDestroy(v_vec);
                                          N_VDestroy(x_00);
                                          N_VDestroy(A);
                                          SUNContext_Free(&local_88);
                                          local_4 = local_18;
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              printf("FAIL: SUNLinSol_SPGMR module failed %i initialization tests\n\n"
                                     ,(ulong)uVar12);
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                printf("ERROR: Solver tolerance must be a positive real number\n");
                local_4 = 1;
              }
            }
          }
        }
      }
    }
  }
  else {
    printf("ERROR: SUNContext_Create failed\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int gstype, pretype, maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 7)
  {
    printf("ERROR: SIX (6) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Gram-Schmidt orthogonalization type should be 1 or 2\n");
    printf("  Preconditioning type should be 1 or 2\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  gstype = atoi(argv[2]);
  if ((gstype < 1) || (gstype > 2))
  {
    printf(
      "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2\n");
    return 1;
  }
  pretype = atoi(argv[3]);
  if ((pretype < 1) || (pretype > 2))
  {
    printf("ERROR: Preconditioning type must be either 1 or 2\n");
    return 1;
  }
  maxl = atoi(argv[4]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[5]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[6]);
  SetTiming(print_timing);

  printf("\nSPGMR linear solver test:\n");
  printf("  Problem size = %ld\n", (long int)ProbData.N);
  printf("  Gram-Schmidt orthogonalization type = %i\n", gstype);
  printf("  Preconditioning type = %i\n", pretype);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s1 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s1, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s2 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s2, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create SPGMR linear solver */
  LS = SUNLinSol_SPGMR(x, pretype, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_SPGMR, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s1, ProbData.s2, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  fails += SUNLinSol_SPGMRSetGSType(LS, gstype);
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf(
      "SUCCESS: SUNLinSol_SPGMR module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 1, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 2, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaled rows (no preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 3, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaled rows (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 4, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 4, passed all tests\n\n");
  }

  /*** Test 5: Poisson-like solve w/ scaled columns (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 5, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 5, passed all tests\n\n");
  }

  /*** Test 6: Poisson-like solve w/ scaled columns (Jacobi preconditioning) ***/

  /* set scaling vector, Jacobi solver vector */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPGMRSetPrecType(LS, pretype);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPGMR module, problem 6, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPGMR module, problem 6, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s1);
  N_VDestroy(ProbData.s2);
  SUNContext_Free(&sunctx);

  return (passfail);
}